

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O0

bool anon_unknown.dwarf_107184::IsAmstradTape(shared_ptr<Storage::Tape::Tape> *tape)

{
  bool bVar1;
  Block *pBVar2;
  _Optional_payload_base<Storage::Tape::ZXSpectrum::Block> local_92;
  undefined1 local_90 [6];
  optional<Storage::Tape::ZXSpectrum::Block> block;
  Parser parser;
  shared_ptr<Storage::Tape::Tape> *tape_local;
  
  Storage::Tape::ZXSpectrum::Parser::Parser((Parser *)local_90,AmstradCPC);
  do {
    local_92 = (_Optional_payload_base<Storage::Tape::ZXSpectrum::Block>)
               Storage::Tape::ZXSpectrum::Parser::find_block((Parser *)local_90,tape);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_92);
    if (!bVar1) {
      tape_local._7_1_ = false;
      goto LAB_00181a62;
    }
    pBVar2 = std::optional<Storage::Tape::ZXSpectrum::Block>::operator->
                       ((optional<Storage::Tape::ZXSpectrum::Block> *)&local_92);
  } while (pBVar2->type != ',');
  tape_local._7_1_ = true;
LAB_00181a62:
  Storage::Tape::ZXSpectrum::Parser::~Parser((Parser *)local_90);
  return tape_local._7_1_;
}

Assistant:

bool IsAmstradTape(const std::shared_ptr<Storage::Tape::Tape> &tape) {
	// Limited sophistication here; look for a CPC-style file header, that is
	// any Spectrum-esque block with a synchronisation character of 0x2c.
	//
	// More could be done here: parse the header, look for 0x16 data records.
	using Parser = Storage::Tape::ZXSpectrum::Parser;
	Parser parser(Parser::MachineType::AmstradCPC);

	while(true) {
		const auto block = parser.find_block(tape);
		if(!block) break;

		if(block->type == 0x2c) {
			return true;
		}
	}

	return false;
}